

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O1

bool Js::CompoundString::TryAppendGeneric<Js::CompoundString::Builder<256u>>
               (JavascriptString *s,void *packedSubstringInfo,void *packedSubstringInfo2,
               CharCount appendCharLength,Builder<256U> *toString)

{
  Type *addr;
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  CharCount CVar4;
  CharCount CVar5;
  undefined4 *puVar6;
  Type *pTVar7;
  JavascriptString *pJVar8;
  int iVar9;
  uint uVar10;
  
  if (s == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3b7,"(s)","s");
    if (!bVar2) goto LAB_00d53c38;
    *puVar6 = 0;
  }
  if (packedSubstringInfo == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3b8,"(packedSubstringInfo)","packedSubstringInfo");
    if (!bVar2) goto LAB_00d53c38;
    *puVar6 = 0;
  }
  cVar3 = JavascriptString::GetLength(s);
  if (cVar3 < appendCharLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3b9,"(appendCharLength <= s->GetLength())",
                                "appendCharLength <= s->GetLength()");
    if (!bVar2) goto LAB_00d53c38;
    *puVar6 = 0;
  }
  if (toString == (Builder<256U> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ba,"(toString)","toString");
    if (!bVar2) goto LAB_00d53c38;
    *puVar6 = 0;
  }
  if (toString->isFinalized == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3bb,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00d53c38;
    *puVar6 = 0;
  }
  if (toString->directCharLength == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3bd,"(!toString->HasOnlyDirectChars())",
                                "!toString->HasOnlyDirectChars()");
    if (!bVar2) {
LAB_00d53c38:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  CVar4 = Block::PointerLengthFromCharLength(toString->charLength);
  iVar9 = 3 - (uint)(packedSubstringInfo2 == (void *)0x0);
  if (CVar4 < 0x41U - iVar9) {
    pTVar7 = Block::Pointers(toString);
    pJVar8 = GetImmutableOrScriptUnreferencedString(s);
    addr = pTVar7 + CVar4;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pJVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    if (packedSubstringInfo2 != (void *)0x0) {
      Memory::Recycler::WBSetBit((char *)(pTVar7 + (CVar4 + 1)));
      pTVar7[CVar4 + 1].ptr = packedSubstringInfo2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar7 + (CVar4 + 1));
    }
    uVar10 = (CVar4 + iVar9) - 1;
    Memory::Recycler::WBSetBit((char *)(pTVar7 + uVar10));
    pTVar7[uVar10].ptr = packedSubstringInfo;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar7 + uVar10);
    uVar10 = appendCharLength + toString->stringLength;
    bVar2 = IsValidCharCount((ulong)uVar10);
    if (!bVar2) {
      Throw::OutOfMemory();
    }
    toString->stringLength = uVar10;
    CVar5 = Block::CharLengthFromPointerLength(iVar9 + CVar4);
    toString->charLength = CVar5;
  }
  return CVar4 < 0x41U - iVar9;
}

Assistant:

inline bool CompoundString::TryAppendGeneric(
        JavascriptString *const s,
        void *const packedSubstringInfo,
        void *const packedSubstringInfo2,
        const CharCount appendCharLength,
        String *const toString)
    {
        Assert(s);
        Assert(packedSubstringInfo);
        Assert(appendCharLength <= s->GetLength());
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!toString->HasOnlyDirectChars());

        const CharCount blockPointerLength = toString->LastBlockPointerLength();
        const CharCount appendPointerLength = 2 + !!packedSubstringInfo2;
        if(blockPointerLength < toString->LastBlockPointerCapacity() - (appendPointerLength - 1))
        {
            Field(void*)* pointers = toString->LastBlockPointers();
            pointers[blockPointerLength] = GetImmutableOrScriptUnreferencedString(s);
            if(packedSubstringInfo2)
                pointers[blockPointerLength + 1] = packedSubstringInfo2;
            pointers[blockPointerLength + (appendPointerLength - 1)] = packedSubstringInfo;
            toString->SetLength(toString->GetLength() + appendCharLength);
            toString->SetLastBlockPointerLength(blockPointerLength + appendPointerLength);
            return true;
        }
        return false;
    }